

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISkin.cpp
# Opt level: O0

void __thiscall irr::gui::CGUISkin::setFont(CGUISkin *this,IGUIFont *font,EGUI_DEFAULT_FONT which)

{
  uint in_EDX;
  long *in_RSI;
  long in_RDI;
  IReferenceCounted *in_stack_ffffffffffffffd8;
  
  if ((in_EDX < 5) && (in_RSI != (long *)0x0)) {
    IReferenceCounted::grab((IReferenceCounted *)((long)in_RSI + *(long *)(*in_RSI + -0x18)));
    if (*(long *)(in_RDI + 0x128 + (ulong)in_EDX * 8) != 0) {
      IReferenceCounted::drop(in_stack_ffffffffffffffd8);
    }
    *(long **)(in_RDI + 0x128 + (ulong)in_EDX * 8) = in_RSI;
  }
  return;
}

Assistant:

void CGUISkin::setFont(IGUIFont *font, EGUI_DEFAULT_FONT which)
{
	if ((u32)which >= EGDF_COUNT)
		return;

	if (font) {
		font->grab();
		if (Fonts[which])
			Fonts[which]->drop();

		Fonts[which] = font;
	}
}